

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSearch.cpp
# Opt level: O2

NodeResult __thiscall HighsSearch::branch(HighsSearch *this)

{
  double dVar1;
  uint uVar2;
  HighsLpRelaxation *pHVar3;
  HighsPseudocost *pHVar4;
  pointer ppVar5;
  pointer pdVar6;
  long lVar7;
  int *piVar8;
  pointer pHVar9;
  pointer pHVar10;
  HighsLpRelaxation *pHVar11;
  HighsDomain *this_00;
  HighsInt HVar12;
  NodeResult NVar13;
  HighsBoundType HVar14;
  long lVar15;
  HighsMipSolver *pHVar16;
  double *pdVar17;
  vector<double,_std::allocator<double>_> *pvVar18;
  int iVar19;
  long lVar20;
  double *pdVar21;
  pointer pNVar22;
  HighsLpRelaxation *__tmp;
  int *piVar23;
  int64_t maxSbIters;
  pointer __args;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var24;
  bool bVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar30;
  double dVar31;
  double dVar32;
  allocator local_5461;
  undefined1 local_5460 [32];
  double upNodeLb;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5420;
  undefined1 local_5418 [12];
  HighsBoundType HStack_540c;
  undefined1 local_5408 [16];
  HighsDomain *local_53f8;
  vector<HighsSearch::NodeData,std::allocator<HighsSearch::NodeData>> *local_53f0;
  double downNodeLb;
  Highs HStack_53e0;
  
  local_53f0 = (vector<HighsSearch::NodeData,std::allocator<HighsSearch::NodeData>> *)
               &this->nodestack;
  pNVar22 = (this->nodestack).
            super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  pNVar22[-1].branchingdecision.column = -1;
  this->inbranching = true;
  uVar2 = this->pseudocost->minreliable;
  local_5420._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar2;
  stack0xffffffffffffabf0 = (double)local_5418._0_8_;
  local_5418._0_8_ = (double)(int)uVar2;
  local_5460._0_8_ = pNVar22[-1].lower_bound;
  local_5408._8_8_ = local_5408._0_8_;
  local_5408._0_8_ = (double)(int)(uVar2 - 1);
  local_53f8 = &this->localdom;
  NVar13 = kOpen;
  pdVar17 = &downNodeLb;
  pdVar21 = &upNodeLb;
  local_5460._8_8_ = local_5460._0_8_;
  while (bVar25 = pNVar22[-1].opensubtrees != '\x02', !bVar25) {
    pHVar3 = this->lp;
    if (((kUnscaledInfeasible < pHVar3->status) || ((0x3aU >> (pHVar3->status & 0x1f) & 1) == 0)) ||
       ((pHVar3->fractionalints).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start ==
        (pHVar3->fractionalints).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish)) break;
    if ((int)local_5420._M_pi < 1) {
      maxSbIters = 0;
    }
    else {
      _Var24._M_head_impl =
           (this->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
      lVar15 = (_Var24._M_head_impl)->sb_lp_iterations + this->sblpiterations;
      maxSbIters = ((this->lpiterations + (_Var24._M_head_impl)->total_lp_iterations) -
                    (this->heurlpiterations + lVar15 +
                    (_Var24._M_head_impl)->heuristic_lp_iterations) >> 1) + 100000;
      iVar19 = 0;
      if (lVar15 <= maxSbIters) {
        lVar20 = maxSbIters >> 1;
        if (lVar15 - lVar20 == 0 || lVar15 < lVar20) goto LAB_002e5cf4;
        iVar19 = (int)((double)local_5418._0_8_ -
                      ((double)(lVar15 - lVar20) / (double)(maxSbIters - lVar20)) *
                      (double)local_5408._0_8_);
        if ((int)local_5420._M_pi < iVar19) {
          iVar19 = (int)local_5420._M_pi;
        }
      }
      this->pseudocost->minreliable = iVar19;
    }
LAB_002e5cf4:
    dVar30 = HighsLpRelaxation::computeLPDegneracy(pHVar3,local_53f8);
    pHVar4 = this->pseudocost;
    pHVar4->degeneracyFactor = dVar30;
    if (10.0 <= dVar30) {
      pHVar4->minreliable = 0;
    }
    upNodeLb = (this->nodestack).
               super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>.
               _M_impl.super__Vector_impl_data._M_finish[-1].lower_bound;
    downNodeLb = upNodeLb;
    HVar12 = selectBranchingCandidate(this,maxSbIters,pdVar17,pdVar21);
    pNVar22 = (this->nodestack).
              super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    local_5460._0_8_ = pNVar22[-1].lower_bound;
    if (HVar12 != -1) {
      NVar13 = kBranched;
      pHVar3 = this->lp;
      ppVar5 = (pHVar3->fractionalints).
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      iVar19 = ppVar5[HVar12].first;
      lVar15 = (long)iVar19;
      local_5460._8_8_ = ppVar5[HVar12].second;
      uVar26 = (undefined4)local_5460._8_8_;
      uVar27 = (undefined4)((ulong)local_5460._8_8_ >> 0x20);
      pNVar22[-1].branchingdecision.column = iVar19;
      pNVar22[-1].branching_point = (double)local_5460._8_8_;
      dVar30 = (double)local_5460._0_8_;
      switch(this->childselrule) {
      case kUp:
        break;
      case kDown:
switchD_002e5dd0_caseD_1:
        pNVar22[-1].branchingdecision.boundtype = kUpper;
        local_5460._8_8_ = local_5460._0_8_;
        goto LAB_002e60bc;
      case kRootSol:
        _Var24._M_head_impl =
             (this->mipsolver->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
        dVar30 = (_Var24._M_head_impl)->epsilon +
                 (this->pseudocost->inferencesup).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar15];
        local_5418._8_4_ = SUB84(dVar30,0);
        local_5418._0_8_ =
             (_Var24._M_head_impl)->epsilon +
             (this->pseudocost->inferencesdown).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar15];
        HStack_540c = (HighsBoundType)((ulong)dVar30 >> 0x20);
        local_5460._16_8_ = 0.0;
        dVar30 = floor((double)local_5460._8_8_);
        local_5408._0_8_ = dVar30;
        dVar30 = ceil((double)local_5460._8_8_);
        uVar26 = SUB84(dVar30,0);
        uVar27 = (undefined4)((ulong)dVar30 >> 0x20);
        pdVar6 = (this->subrootsol).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (pdVar6 == (this->subrootsol).super__Vector_base<double,_std::allocator<double>_>._M_impl
                      .super__Vector_impl_data._M_finish) {
          if (-INFINITY < pNVar22[-1].lp_objective) {
            local_5460._8_8_ = dVar30;
            std::vector<double,_std::allocator<double>_>::operator=
                      (&this->subrootsol,&(pHVar3->lpsolver).solution_.col_value);
            uVar26 = (undefined4)local_5460._8_8_;
            uVar27 = SUB84(local_5460._8_8_,4);
            _Var24._M_head_impl =
                 (this->mipsolver->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
          }
          pdVar6 = *(pointer *)
                    &((_Var24._M_head_impl)->rootlpsol).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl;
          dVar30 = (double)local_5418._0_8_;
          dVar32 = stack0xffffffffffffabf0;
          if (pdVar6 != *(pointer *)
                         ((long)&((_Var24._M_head_impl)->rootlpsol).
                                 super__Vector_base<double,_std::allocator<double>_> + 8)) {
            dVar30 = pdVar6[lVar15];
            dVar32 = (double)local_5408._0_8_;
            if (((double)local_5408._0_8_ <= dVar30) &&
               (dVar32 = dVar30,
               (double)CONCAT44(uVar27,uVar26) <= dVar30 &&
               dVar30 != (double)CONCAT44(uVar27,uVar26))) {
              dVar32 = (double)CONCAT44(uVar27,uVar26);
            }
            dVar30 = (double)local_5418._0_8_ * ((dVar32 - pNVar22[-1].branching_point) + 1.0);
            dVar32 = stack0xffffffffffffabf0 * ((pNVar22[-1].branching_point - dVar32) + 1.0);
          }
        }
        else {
          dVar32 = pdVar6[lVar15];
          dVar31 = (double)local_5408._0_8_;
          if (((double)local_5408._0_8_ <= dVar32) && (dVar31 = dVar32, dVar30 < dVar32)) {
            dVar31 = dVar30;
          }
          dVar30 = (double)local_5418._0_8_ * ((dVar31 - (double)local_5460._8_8_) + 1.0);
          dVar32 = stack0xffffffffffffabf0 * (((double)local_5460._8_8_ - dVar31) + 1.0);
        }
        bVar25 = dVar30 <= dVar32 + (_Var24._M_head_impl)->epsilon;
        if (bVar25) {
          pdVar17 = &upNodeLb;
          pdVar21 = &downNodeLb;
        }
        else {
          pdVar17 = &downNodeLb;
          pdVar21 = &upNodeLb;
          uVar26 = (undefined4)local_5408._0_8_;
          uVar27 = (undefined4)((ulong)local_5408._0_8_ >> 0x20);
        }
        dVar30 = *pdVar21;
        pNVar22[-1].branchingdecision.boundtype = (uint)!bVar25;
        pNVar22[-1].branchingdecision.boundval = (double)CONCAT44(uVar27,uVar26);
        pNVar22[-1].other_child_lb = dVar30;
        uVar26 = SUB84(*pdVar17,0);
        uVar27 = (undefined4)((ulong)*pdVar17 >> 0x20);
        goto LAB_002e6220;
      case kObj:
        pHVar16 = this->mipsolver;
LAB_002e5ecd:
        if ((pHVar16->model_->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl
            .super__Vector_impl_data._M_start[lVar15] < 0.0) goto switchD_002e5dd0_caseD_1;
        break;
      case kRandom:
        local_5460._8_8_ = local_5460._0_8_;
        bVar25 = HighsRandom::bit(&this->random);
        if (bVar25) goto LAB_002e5ebd;
LAB_002e5fa0:
        pNVar22[-1].branchingdecision.boundtype = kUpper;
        uVar26 = SUB84(pNVar22[-1].branching_point,0);
        uVar27 = (undefined4)((ulong)pNVar22[-1].branching_point >> 0x20);
LAB_002e60bc:
        dVar30 = floor((double)CONCAT44(uVar27,uVar26));
        pNVar22[-1].branchingdecision.boundval = dVar30;
        pNVar22[-1].other_child_lb = upNodeLb;
        uVar26 = SUB84(downNodeLb,0);
        uVar27 = (undefined4)((ulong)downNodeLb >> 0x20);
        goto LAB_002e6220;
      case kBestCost:
        dVar30 = (double)local_5460._8_8_;
        local_5460._8_8_ = local_5460._0_8_;
        local_5460._8_8_ =
             HighsPseudocost::getPseudocostUp
                       (this->pseudocost,iVar19,dVar30,
                        ((this->mipsolver->mipdata_)._M_t.
                         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                         .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol)
        ;
        dVar30 = HighsPseudocost::getPseudocostDown
                           (this->pseudocost,iVar19,pNVar22[-1].branching_point,
                            ((this->mipsolver->mipdata_)._M_t.
                             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                             .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                            feastol);
        if (dVar30 < (double)local_5460._8_8_) goto LAB_002e5fa0;
        goto LAB_002e5ebd;
      case kWorstCost:
        dVar30 = (double)local_5460._8_8_;
        local_5460._8_8_ = local_5460._0_8_;
        local_5460._8_8_ = HighsPseudocost::getPseudocostUp(this->pseudocost,iVar19,dVar30);
        dVar30 = HighsPseudocost::getPseudocostDown
                           (this->pseudocost,iVar19,pNVar22[-1].branching_point);
        if ((double)local_5460._8_8_ < dVar30) goto LAB_002e5fa0;
LAB_002e5ebd:
        pNVar22[-1].branchingdecision.boundtype = kLower;
        uVar26 = SUB84(pNVar22[-1].branching_point,0);
        uVar27 = (undefined4)((ulong)pNVar22[-1].branching_point >> 0x20);
        goto LAB_002e5f1d;
      case kDisjunction:
        pHVar16 = this->mipsolver;
        _Var24._M_head_impl =
             (pHVar16->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
        lVar20 = *(long *)((long)((NodeSetArray *)((long)&(_Var24._M_head_impl)->nodequeue + 0x40))
                                 ->_M_t + 0x30 + lVar15 * 0x38);
        lVar7 = *(long *)((long)((NodeSetArray *)((long)&(_Var24._M_head_impl)->nodequeue + 0x48))->
                                _M_t + 0x30 + lVar15 * 0x38);
        if (lVar20 <= lVar7) {
          if (lVar7 <= lVar20) goto LAB_002e5ecd;
          goto switchD_002e5dd0_caseD_1;
        }
        break;
      case kHybridInferenceCost:
        local_5418._8_4_ = 0;
        HStack_540c = kLower;
        local_5418._0_8_ =
             (this->pseudocost->inferencesup).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar15];
        local_5460._16_8_ = 0.0;
        dVar30 = HighsPseudocost::getPseudocostUp
                           (this->pseudocost,iVar19,(double)local_5460._8_8_,
                            ((this->mipsolver->mipdata_)._M_t.
                             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                             .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                            feastol);
        local_5408._8_4_ = extraout_XMM0_Dc;
        local_5408._0_8_ = dVar30;
        local_5408._12_4_ = extraout_XMM0_Dd;
        dVar30 = (this->pseudocost->inferencesdown).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar15];
        local_5418._8_4_ = SUB84(dVar30,0);
        HStack_540c = (HighsBoundType)((ulong)dVar30 >> 0x20);
        dVar30 = HighsPseudocost::getPseudocostDown
                           (this->pseudocost,iVar19,pNVar22[-1].branching_point,
                            ((this->mipsolver->mipdata_)._M_t.
                             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                             .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                            feastol);
        auVar28._0_8_ = (double)local_5418._0_8_ + 1.0;
        auVar28._8_8_ = stack0xffffffffffffabf0 + 1.0;
        auVar29._8_4_ = SUB84(dVar30,0);
        auVar29._0_8_ = local_5408._0_8_;
        auVar29._12_4_ = (int)((ulong)dVar30 >> 0x20);
        auVar29 = divpd(auVar28,auVar29);
        bVar25 = auVar29._8_8_ <= auVar29._0_8_;
        if (bVar25) {
          dVar30 = ceil((double)local_5460._8_8_);
          uVar26 = SUB84(dVar30,0);
          uVar27 = (undefined4)((ulong)dVar30 >> 0x20);
        }
        else {
          dVar30 = floor((double)local_5460._8_8_);
          uVar26 = SUB84(dVar30,0);
          uVar27 = (undefined4)((ulong)dVar30 >> 0x20);
          pdVar21 = &downNodeLb;
          pdVar17 = &upNodeLb;
        }
        dVar30 = *pdVar17;
        pNVar22[-1].branchingdecision.boundtype = (uint)!bVar25;
        pNVar22[-1].branchingdecision.boundval = (double)CONCAT44(uVar27,uVar26);
        pNVar22[-1].other_child_lb = dVar30;
        local_5460._0_8_ = *pdVar21;
        dVar30 = (double)local_5460._0_8_;
      default:
        goto switchD_002e5dd0_default;
      }
      pNVar22[-1].branchingdecision.boundtype = kLower;
      local_5460._8_8_ = local_5460._0_8_;
LAB_002e5f1d:
      dVar30 = ceil((double)CONCAT44(uVar27,uVar26));
      pNVar22[-1].branchingdecision.boundval = dVar30;
      pNVar22[-1].other_child_lb = downNodeLb;
      uVar26 = SUB84(upNodeLb,0);
      uVar27 = (undefined4)((ulong)upNodeLb >> 0x20);
LAB_002e6220:
      local_5460._0_8_ = CONCAT44(uVar27,uVar26);
      dVar30 = (double)CONCAT44(uVar27,uVar26);
switchD_002e5dd0_default:
      local_5460._8_8_ = dVar30;
      pNVar22 = (this->nodestack).
                super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      bVar25 = pNVar22[-1].opensubtrees != '\x02';
      break;
    }
    local_5460._8_8_ = local_5460._0_8_;
    NVar13 = evaluateNode(this);
    if (NVar13 == kSubOptimal) {
      NVar13 = kSubOptimal;
      dVar30 = (double)local_5460._8_8_;
      goto switchD_002e5dd0_default;
    }
    pNVar22 = (this->nodestack).
              super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  this->inbranching = false;
  pHVar4 = this->pseudocost;
  pHVar4->minreliable = (HighsInt)local_5420._M_pi;
  pHVar4->degeneracyFactor = 1.0;
  if ((NVar13 != kSubOptimal) && (!bVar25)) {
    if (pNVar22[-1].branchingdecision.column == -1) {
      pHVar4->degeneracyFactor = 1000000.0;
      _Var24._M_head_impl =
           (this->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
      piVar23 = *(int **)&((_Var24._M_head_impl)->integral_cols).
                          super__Vector_base<int,_std::allocator<int>_>;
      piVar8 = *(pointer *)((long)&(_Var24._M_head_impl)->integral_cols + 8);
      local_5420._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xbff0000000000000;
      for (; dVar30 = 0.5, piVar23 != piVar8; piVar23 = piVar23 + 1) {
        iVar19 = *piVar23;
        dVar32 = (this->localdom).col_upper_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[iVar19];
        dVar31 = (this->localdom).col_lower_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[iVar19];
        if (0.5 <= dVar32 - dVar31) {
          if (dVar31 <= -INFINITY) {
            if (dVar32 < INFINITY) {
              dVar30 = dVar32 + -0.5;
            }
          }
          else {
            dVar30 = dVar31 + 0.5;
          }
          local_5460._8_8_ = dVar30;
          dVar30 = HighsPseudocost::getScore(this->pseudocost,iVar19,dVar30);
          this_00 = local_53f8;
          if ((double)local_5420._M_pi < dVar30) {
            local_5418._0_8_ = dVar30;
            if ((this->lp->status - kOptimal & 0xfffffffd) == 0) {
              pvVar18 = &(this->lp->lpsolver).solution_.col_dual;
              pHVar16 = this->mipsolver;
            }
            else {
              pHVar16 = this->mipsolver;
              pvVar18 = &pHVar16->model_->col_cost_;
            }
            dVar30 = (pvVar18->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[iVar19];
            _Var24._M_head_impl =
                 (pHVar16->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
            dVar32 = (_Var24._M_head_impl)->feastol;
            if (ABS(dVar30) <= dVar32) {
LAB_002e63da:
              dVar30 = (this->pseudocost->inferencesup).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar19];
              dVar31 = (this->pseudocost->inferencesdown).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar19];
              if (dVar32 + dVar31 < dVar30) goto LAB_002e6403;
              if (dVar31 - dVar32 <= dVar30) {
                HighsDomain::getColLowerPos
                          (local_53f8,iVar19,
                           (HighsInt)
                           ((ulong)((long)(this->localdom).domchgstack_.
                                          super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->localdom).domchgstack_.
                                         super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4),
                           (HighsInt *)&downNodeLb);
                HighsDomain::getColUpperPos
                          (this_00,iVar19,
                           (HighsInt)
                           ((ulong)((long)(this->localdom).domchgstack_.
                                          super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->localdom).domchgstack_.
                                         super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4),
                           (HighsInt *)&upNodeLb);
                if (downNodeLb._0_4_ <= upNodeLb._0_4_) goto LAB_002e6403;
              }
LAB_002e6469:
              dVar30 = floor((double)local_5460._8_8_);
              uVar26 = SUB84(dVar30,0);
              uVar27 = (undefined4)((ulong)dVar30 >> 0x20);
              HVar14 = kUpper;
            }
            else {
              dVar31 = this->upper_limit;
              uVar26 = SUB84(dVar31,0);
              uVar27 = (undefined4)((ulong)dVar31 >> 0x20);
              dVar1 = (_Var24._M_head_impl)->upper_limit;
              if (dVar1 <= dVar31) {
                uVar26 = SUB84(dVar1,0);
                uVar27 = (undefined4)((ulong)dVar1 >> 0x20);
              }
              if ((double)CONCAT44(uVar27,uVar26) == INFINITY) goto LAB_002e63da;
              if (dVar30 <= 0.0) goto LAB_002e6469;
LAB_002e6403:
              dVar30 = ceil((double)local_5460._8_8_);
              uVar26 = SUB84(dVar30,0);
              uVar27 = (undefined4)((ulong)dVar30 >> 0x20);
              HVar14 = kLower;
            }
            pNVar22[-1].branching_point = (double)CONCAT44(uVar27,uVar26);
            pNVar22[-1].branchingdecision.boundtype = HVar14;
            pNVar22[-1].branchingdecision.column = iVar19;
            pNVar22[-1].branchingdecision.boundval = (double)CONCAT44(uVar27,uVar26);
            local_5420._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_5418._0_8_;
          }
        }
      }
      this->pseudocost->degeneracyFactor = 1.0;
      if (pNVar22[-1].branchingdecision.column == -1) {
        if (this->lp->status == kOptimal) {
          pNVar22[-1].opensubtrees = '\0';
          return kLpInfeasible;
        }
        HighsLpRelaxation::setIterationLimit(this->lp,0x7fffffff);
        HighsLpRelaxation::HighsLpRelaxation((HighsLpRelaxation *)&downNodeLb,this->mipsolver);
        HighsLpRelaxation::loadModel((HighsLpRelaxation *)&downNodeLb);
        Highs::changeColsBounds
                  (&HStack_53e0,0,this->mipsolver->model_->num_col_ + -1,
                   (this->localdom).col_lower_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (this->localdom).col_upper_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start);
        pHVar3 = this->lp;
        this->lp = (HighsLpRelaxation *)&downNodeLb;
        std::__cxx11::string::string((string *)&upNodeLb,"presolve",&local_5461);
        Highs::setOptionValue(&HStack_53e0,(string *)&upNodeLb,&::kHighsOnString_abi_cxx11_);
        std::__cxx11::string::~string((string *)&upNodeLb);
        NVar13 = evaluateNode(this);
        if (NVar13 == kOpen) {
          Highs::clearSolver(&this->lp->lpsolver);
          pHVar11 = this->lp;
          std::__cxx11::string::string((string *)&upNodeLb,"simplex_strategy",&local_5461);
          Highs::setOptionValue(&pHVar11->lpsolver,(string *)&upNodeLb,4);
          std::__cxx11::string::~string((string *)&upNodeLb);
          NVar13 = evaluateNode(this);
          pHVar11 = this->lp;
          std::__cxx11::string::string((string *)&upNodeLb,"simplex_strategy",&local_5461);
          Highs::setOptionValue(&pHVar11->lpsolver,(string *)&upNodeLb,1);
          std::__cxx11::string::~string((string *)&upNodeLb);
          if (NVar13 == kOpen) {
            Highs::clearSolver(&this->lp->lpsolver);
            pHVar11 = this->lp;
            std::__cxx11::string::string((string *)&upNodeLb,"solver",&local_5461);
            Highs::setOptionValue(&pHVar11->lpsolver,(string *)&upNodeLb,"ipm");
            std::__cxx11::string::~string((string *)&upNodeLb);
            NVar13 = evaluateNode(this);
            if (NVar13 == kOpen) {
              highsLogUser(&(this->mipsolver->options_mip_->super_HighsOptionsStruct).log_options,
                           kWarning,
                           "Failed to solve node with all integer columns fixed. Declaring node infeasible.\n"
                          );
              pNVar22[-1].opensubtrees = '\0';
              NVar13 = kLpInfeasible;
            }
          }
        }
        this->lp = pHVar3;
        HighsLpRelaxation::~HighsLpRelaxation((HighsLpRelaxation *)&downNodeLb);
        return NVar13;
      }
      local_5460._8_8_ = local_5460._0_8_;
    }
    pHVar9 = (this->localdom).domchgstack_.
             super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pHVar10 = (this->localdom).domchgstack_.
              super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
              super__Vector_impl_data._M_start;
    bVar25 = orbitsValidInChildNode(this,&pNVar22[-1].branchingdecision);
    HighsDomain::changeBound(local_53f8,pNVar22[-1].branchingdecision,(Reason)0xffffffff);
    pNVar22[-1].opensubtrees = '\x01';
    __args = (pointer)local_5460;
    if ((double)local_5460._8_8_ < pNVar22[-1].lower_bound) {
      __args = pNVar22 + -1;
    }
    if (bVar25) {
      std::__shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2> *)&downNodeLb,
                 &pNVar22[-1].stabilizerOrbits.
                  super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>);
    }
    else {
      downNodeLb = 0.0;
      HStack_53e0._vptr_Highs = (_func_int **)0x0;
    }
    std::vector<HighsSearch::NodeData,std::allocator<HighsSearch::NodeData>>::
    emplace_back<double_const&,double&,std::shared_ptr<HighsBasis_const>&,std::shared_ptr<StabilizerOrbits_const>>
              (local_53f0,&__args->lower_bound,&pNVar22[-1].estimate,&pNVar22[-1].nodeBasis,
               (shared_ptr<const_StabilizerOrbits> *)&downNodeLb);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&HStack_53e0);
    (this->nodestack).
    super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>._M_impl.
    super__Vector_impl_data._M_finish[-1].domgchgStackPos =
         (HighsInt)((ulong)((long)pHVar9 - (long)pHVar10) >> 4);
    NVar13 = kBranched;
  }
  return NVar13;
}

Assistant:

HighsSearch::NodeResult HighsSearch::branch() {
  assert(localdom.getChangedCols().empty());

  assert(nodestack.back().opensubtrees == 2);
  nodestack.back().branchingdecision.column = -1;
  inbranching = true;

  HighsInt minrel = pseudocost.getMinReliable();
  double childLb = getCurrentLowerBound();
  NodeResult result = NodeResult::kOpen;
  while (nodestack.back().opensubtrees == 2 &&
         lp->scaledOptimal(lp->getStatus()) &&
         !lp->getFractionalIntegers().empty()) {
    int64_t sbmaxiters = 0;
    if (minrel > 0) {
      int64_t sbiters = getStrongBranchingLpIterations();
      sbmaxiters =
          100000 + ((getTotalLpIterations() - getHeuristicLpIterations() -
                     getStrongBranchingLpIterations()) >>
                    1);
      if (sbiters > sbmaxiters) {
        pseudocost.setMinReliable(0);
      } else if (sbiters > (sbmaxiters >> 1)) {
        double reductionratio = (sbiters - (sbmaxiters >> 1)) /
                                (double)(sbmaxiters - (sbmaxiters >> 1));

        HighsInt minrelreduced = int(minrel - reductionratio * (minrel - 1));
        pseudocost.setMinReliable(std::min(minrel, minrelreduced));
      }
    }

    double degeneracyFac = lp->computeLPDegneracy(localdom);
    pseudocost.setDegeneracyFactor(degeneracyFac);
    if (degeneracyFac >= 10.0) pseudocost.setMinReliable(0);
    // if (!mipsolver.submip)
    //  printf("selecting branching cand with minrel=%d\n",
    //         pseudocost.getMinReliable());
    double downNodeLb = getCurrentLowerBound();
    double upNodeLb = getCurrentLowerBound();
    HighsInt branchcand =
        selectBranchingCandidate(sbmaxiters, downNodeLb, upNodeLb);
    // if (!mipsolver.submip)
    //   printf("branching cand returned as %d\n", branchcand);
    NodeData& currnode = nodestack.back();
    childLb = currnode.lower_bound;
    if (branchcand != -1) {
      auto branching = lp->getFractionalIntegers()[branchcand];
      currnode.branchingdecision.column = branching.first;
      currnode.branching_point = branching.second;

      HighsInt col = branching.first;

      switch (childselrule) {
        case ChildSelectionRule::kUp:
          currnode.branchingdecision.boundtype = HighsBoundType::kLower;
          currnode.branchingdecision.boundval =
              std::ceil(currnode.branching_point);
          currnode.other_child_lb = downNodeLb;
          childLb = upNodeLb;
          break;
        case ChildSelectionRule::kDown:
          currnode.branchingdecision.boundtype = HighsBoundType::kUpper;
          currnode.branchingdecision.boundval =
              std::floor(currnode.branching_point);
          currnode.other_child_lb = upNodeLb;
          childLb = downNodeLb;
          break;
        case ChildSelectionRule::kRootSol: {
          double downPrio = pseudocost.getAvgInferencesDown(col) +
                            mipsolver.mipdata_->epsilon;
          double upPrio =
              pseudocost.getAvgInferencesUp(col) + mipsolver.mipdata_->epsilon;
          double downVal = std::floor(currnode.branching_point);
          double upVal = std::ceil(currnode.branching_point);
          if (!subrootsol.empty()) {
            double rootsol = subrootsol[col];
            if (rootsol < downVal)
              rootsol = downVal;
            else if (rootsol > upVal)
              rootsol = upVal;

            upPrio *= (1.0 + (currnode.branching_point - rootsol));
            downPrio *= (1.0 + (rootsol - currnode.branching_point));

          } else {
            if (currnode.lp_objective != -kHighsInf)
              subrootsol = lp->getSolution().col_value;
            if (!mipsolver.mipdata_->rootlpsol.empty()) {
              double rootsol = mipsolver.mipdata_->rootlpsol[col];
              if (rootsol < downVal)
                rootsol = downVal;
              else if (rootsol > upVal)
                rootsol = upVal;

              upPrio *= (1.0 + (currnode.branching_point - rootsol));
              downPrio *= (1.0 + (rootsol - currnode.branching_point));
            }
          }
          if (upPrio + mipsolver.mipdata_->epsilon >= downPrio) {
            currnode.branchingdecision.boundtype = HighsBoundType::kLower;
            currnode.branchingdecision.boundval = upVal;
            currnode.other_child_lb = downNodeLb;
            childLb = upNodeLb;
          } else {
            currnode.branchingdecision.boundtype = HighsBoundType::kUpper;
            currnode.branchingdecision.boundval = downVal;
            currnode.other_child_lb = upNodeLb;
            childLb = downNodeLb;
          }
          break;
        }
        case ChildSelectionRule::kObj:
          if (mipsolver.colCost(col) >= 0) {
            currnode.branchingdecision.boundtype = HighsBoundType::kLower;
            currnode.branchingdecision.boundval =
                std::ceil(currnode.branching_point);
            currnode.other_child_lb = downNodeLb;
            childLb = upNodeLb;
          } else {
            currnode.branchingdecision.boundtype = HighsBoundType::kUpper;
            currnode.branchingdecision.boundval =
                std::floor(currnode.branching_point);
            currnode.other_child_lb = upNodeLb;
            childLb = downNodeLb;
          }
          break;
        case ChildSelectionRule::kRandom:
          if (random.bit()) {
            currnode.branchingdecision.boundtype = HighsBoundType::kLower;
            currnode.branchingdecision.boundval =
                std::ceil(currnode.branching_point);
            currnode.other_child_lb = downNodeLb;
            childLb = upNodeLb;
          } else {
            currnode.branchingdecision.boundtype = HighsBoundType::kUpper;
            currnode.branchingdecision.boundval =
                std::floor(currnode.branching_point);
            currnode.other_child_lb = upNodeLb;
            childLb = downNodeLb;
          }
          break;
        case ChildSelectionRule::kBestCost: {
          if (pseudocost.getPseudocostUp(col, currnode.branching_point,
                                         mipsolver.mipdata_->feastol) >
              pseudocost.getPseudocostDown(col, currnode.branching_point,
                                           mipsolver.mipdata_->feastol)) {
            currnode.branchingdecision.boundtype = HighsBoundType::kUpper;
            currnode.branchingdecision.boundval =
                std::floor(currnode.branching_point);
            currnode.other_child_lb = upNodeLb;
            childLb = downNodeLb;
          } else {
            currnode.branchingdecision.boundtype = HighsBoundType::kLower;
            currnode.branchingdecision.boundval =
                std::ceil(currnode.branching_point);
            currnode.other_child_lb = downNodeLb;
            childLb = upNodeLb;
          }
          break;
        }
        case ChildSelectionRule::kWorstCost:
          if (pseudocost.getPseudocostUp(col, currnode.branching_point) >=
              pseudocost.getPseudocostDown(col, currnode.branching_point)) {
            currnode.branchingdecision.boundtype = HighsBoundType::kLower;
            currnode.branchingdecision.boundval =
                std::ceil(currnode.branching_point);
            currnode.other_child_lb = downNodeLb;
            childLb = upNodeLb;
          } else {
            currnode.branchingdecision.boundtype = HighsBoundType::kUpper;
            currnode.branchingdecision.boundval =
                std::floor(currnode.branching_point);
            currnode.other_child_lb = upNodeLb;
            childLb = downNodeLb;
          }
          break;
        case ChildSelectionRule::kDisjunction: {
          int64_t numnodesup;
          int64_t numnodesdown;
          numnodesup = mipsolver.mipdata_->nodequeue.numNodesUp(col);
          numnodesdown = mipsolver.mipdata_->nodequeue.numNodesDown(col);
          if (numnodesup > numnodesdown) {
            currnode.branchingdecision.boundtype = HighsBoundType::kLower;
            currnode.branchingdecision.boundval =
                std::ceil(currnode.branching_point);
            currnode.other_child_lb = downNodeLb;
            childLb = upNodeLb;
          } else if (numnodesdown > numnodesup) {
            currnode.branchingdecision.boundtype = HighsBoundType::kUpper;
            currnode.branchingdecision.boundval =
                std::floor(currnode.branching_point);
            currnode.other_child_lb = upNodeLb;
            childLb = downNodeLb;
          } else {
            if (mipsolver.colCost(col) >= 0) {
              currnode.branchingdecision.boundtype = HighsBoundType::kLower;
              currnode.branchingdecision.boundval =
                  std::ceil(currnode.branching_point);
              currnode.other_child_lb = downNodeLb;
              childLb = upNodeLb;
            } else {
              currnode.branchingdecision.boundtype = HighsBoundType::kUpper;
              currnode.branchingdecision.boundval =
                  std::floor(currnode.branching_point);
              currnode.other_child_lb = upNodeLb;
              childLb = downNodeLb;
            }
          }
          break;
        }
        case ChildSelectionRule::kHybridInferenceCost: {
          double upVal = std::ceil(currnode.branching_point);
          double downVal = std::floor(currnode.branching_point);
          double upScore =
              (1 + pseudocost.getAvgInferencesUp(col)) /
              pseudocost.getPseudocostUp(col, currnode.branching_point,
                                         mipsolver.mipdata_->feastol);
          double downScore =
              (1 + pseudocost.getAvgInferencesDown(col)) /
              pseudocost.getPseudocostDown(col, currnode.branching_point,
                                           mipsolver.mipdata_->feastol);

          if (upScore >= downScore) {
            currnode.branchingdecision.boundtype = HighsBoundType::kLower;
            currnode.branchingdecision.boundval = upVal;
            currnode.other_child_lb = downNodeLb;
            childLb = upNodeLb;
          } else {
            currnode.branchingdecision.boundtype = HighsBoundType::kUpper;
            currnode.branchingdecision.boundval = downVal;
            currnode.other_child_lb = upNodeLb;
            childLb = downNodeLb;
          }
        }
      }
      result = NodeResult::kBranched;
      break;
    }

    assert(!localdom.getChangedCols().empty());
    result = evaluateNode();
    if (result == NodeResult::kSubOptimal) break;
  }
  inbranching = false;
  NodeData& currnode = nodestack.back();
  pseudocost.setMinReliable(minrel);
  pseudocost.setDegeneracyFactor(1.0);

  assert(currnode.opensubtrees == 2 || currnode.opensubtrees == 0);

  if (currnode.opensubtrees != 2 || result == NodeResult::kSubOptimal)
    return result;

  if (currnode.branchingdecision.column == -1) {
    double bestscore = -1.0;
    // solution branching failed, so choose any integer variable to branch
    // on in case we have a different solution status could happen due to a
    // fail in the LP solution process
    pseudocost.setDegeneracyFactor(1e6);

    for (HighsInt i : mipsolver.mipdata_->integral_cols) {
      if (localdom.col_upper_[i] - localdom.col_lower_[i] < 0.5) continue;

      double fracval;
      if (localdom.col_lower_[i] != -kHighsInf &&
          localdom.col_upper_[i] != kHighsInf)
        fracval = std::floor(0.5 * (localdom.col_lower_[i] +
                                    localdom.col_upper_[i] + 0.5)) +
                  0.5;
      if (localdom.col_lower_[i] != -kHighsInf)
        fracval = localdom.col_lower_[i] + 0.5;
      else if (localdom.col_upper_[i] != kHighsInf)
        fracval = localdom.col_upper_[i] - 0.5;
      else
        fracval = 0.5;

      double score = pseudocost.getScore(i, fracval);
      assert(score >= 0.0);

      if (score > bestscore) {
        bestscore = score;
        bool branchUpwards;
        double cost = lp->unscaledDualFeasible(lp->getStatus())
                          ? lp->getSolution().col_dual[i]
                          : mipsolver.colCost(i);
        if (std::fabs(cost) > mipsolver.mipdata_->feastol &&
            getCutoffBound() < kHighsInf) {
          // branch in direction of worsening cost first in case the column has
          // cost and we do have an upper bound
          branchUpwards = cost > 0;
        } else if (pseudocost.getAvgInferencesUp(i) >
                   pseudocost.getAvgInferencesDown(i) +
                       mipsolver.mipdata_->feastol) {
          // column does not have (reduced) cost above tolerance so branch in
          // direction of more inferences
          branchUpwards = true;
        } else if (pseudocost.getAvgInferencesUp(i) <
                   pseudocost.getAvgInferencesDown(i) -
                       mipsolver.mipdata_->feastol) {
          branchUpwards = false;
        } else {
          // number of inferences give a tie, so we branch in the direction that
          // does have a less recent domain change to avoid branching the same
          // integer column into the same direction over and over
          HighsInt colLowerPos;
          HighsInt colUpperPos;
          localdom.getColLowerPos(i, localdom.getNumDomainChanges(),
                                  colLowerPos);
          localdom.getColUpperPos(i, localdom.getNumDomainChanges(),
                                  colUpperPos);
          branchUpwards = colLowerPos <= colUpperPos;
        }
        if (branchUpwards) {
          double upval = std::ceil(fracval);
          currnode.branching_point = upval;
          currnode.branchingdecision.boundtype = HighsBoundType::kLower;
          currnode.branchingdecision.column = i;
          currnode.branchingdecision.boundval = upval;
        } else {
          double downval = std::floor(fracval);
          currnode.branching_point = downval;
          currnode.branchingdecision.boundtype = HighsBoundType::kUpper;
          currnode.branchingdecision.column = i;
          currnode.branchingdecision.boundval = downval;
        }
      }
    }

    pseudocost.setDegeneracyFactor(1);
  }

  if (currnode.branchingdecision.column == -1) {
    if (lp->getStatus() == HighsLpRelaxation::Status::kOptimal) {
      // if the LP was solved to optimality and all columns are fixed, then this
      // particular assignment is not feasible or has a worse objective in the
      // original space, otherwise the node would not be open. Hence we prune
      // this particular assignment
      currnode.opensubtrees = 0;
      result = NodeResult::kLpInfeasible;
      return result;
    }
    lp->setIterationLimit();

    // create a fresh LP only with model rows since all integer columns are
    // fixed, the cutting planes are not required and the LP could not be solved
    // so we want to make it as easy as possible
    HighsLpRelaxation lpCopy(mipsolver);
    lpCopy.loadModel();
    lpCopy.getLpSolver().changeColsBounds(0, mipsolver.numCol() - 1,
                                          localdom.col_lower_.data(),
                                          localdom.col_upper_.data());
    // temporarily use the fresh LP for the HighsSearch class
    HighsLpRelaxation* tmpLp = &lpCopy;
    std::swap(tmpLp, lp);

    // reevaluate the node with LP presolve enabled
    lp->getLpSolver().setOptionValue("presolve", kHighsOnString);
    result = evaluateNode();

    if (result == NodeResult::kOpen) {
      // LP still not solved, reevaluate with primal simplex
      lp->getLpSolver().clearSolver();
      lp->getLpSolver().setOptionValue("simplex_strategy",
                                       kSimplexStrategyPrimal);
      result = evaluateNode();
      lp->getLpSolver().setOptionValue("simplex_strategy",
                                       kSimplexStrategyDual);
      if (result == NodeResult::kOpen) {
        // LP still not solved, reevaluate with IPM instead of simplex
        lp->getLpSolver().clearSolver();
        lp->getLpSolver().setOptionValue("solver", "ipm");
        result = evaluateNode();

        if (result == NodeResult::kOpen) {
          highsLogUser(mipsolver.options_mip_->log_options,
                       HighsLogType::kWarning,
                       "Failed to solve node with all integer columns "
                       "fixed. Declaring node infeasible.\n");
          // LP still not solved, give up and declare as infeasible
          currnode.opensubtrees = 0;
          result = NodeResult::kLpInfeasible;
        }
      }
    }

    // restore old lp relaxation
    std::swap(tmpLp, lp);

    return result;
  }

  // finally open a new node with the branching decision added
  // and remember that we have one open subtree left
  HighsInt domchgPos = localdom.getDomainChangeStack().size();

  bool passStabilizerToChildNode =
      orbitsValidInChildNode(currnode.branchingdecision);
  localdom.changeBound(currnode.branchingdecision);
  currnode.opensubtrees = 1;
  nodestack.emplace_back(
      std::max(childLb, currnode.lower_bound), currnode.estimate,
      currnode.nodeBasis,
      passStabilizerToChildNode ? currnode.stabilizerOrbits : nullptr);
  nodestack.back().domgchgStackPos = domchgPos;

  return NodeResult::kBranched;
}